

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

bool anon_unknown.dwarf_1a0e4cd::IsGroupFeatureSupported
               (cmMakefile *makefile,string *linkLanguage,string *feature)

{
  bool bVar1;
  bool bVar2;
  string featureSupported;
  string local_c0;
  cmAlphaNum local_a0;
  string local_70;
  cmAlphaNum local_50;
  
  local_a0.View_._M_len = (size_t)&DAT_00000006;
  local_a0.View_._M_str = "CMAKE_";
  local_50.View_._M_str = (linkLanguage->_M_dataplus)._M_p;
  local_50.View_._M_len = linkLanguage->_M_string_length;
  cmStrCat<char[19],std::__cxx11::string,char[11]>
            (&local_c0,&local_a0,&local_50,(char (*) [19])0x647727,feature,(char (*) [11])0x65588d);
  local_a0.View_._M_len = (size_t)cmMakefile::GetDefinition(makefile,&local_c0);
  bVar1 = cmValue::IsOn((cmValue *)&local_a0);
  bVar2 = true;
  if (!bVar1) {
    local_a0.View_._M_len = 0x17;
    local_a0.View_._M_str = "CMAKE_LINK_GROUP_USING_";
    local_50.View_._M_str = (feature->_M_dataplus)._M_p;
    local_50.View_._M_len = feature->_M_string_length;
    cmStrCat<char[11]>(&local_70,&local_a0,&local_50,(char (*) [11])0x65588d);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    local_a0.View_._M_len = (size_t)cmMakefile::GetDefinition(makefile,&local_c0);
    bVar2 = cmValue::IsOn((cmValue *)&local_a0);
  }
  std::__cxx11::string::~string((string *)&local_c0);
  return bVar2;
}

Assistant:

bool IsGroupFeatureSupported(cmMakefile* makefile,
                             std::string const& linkLanguage,
                             std::string const& feature)
{
  auto featureSupported = cmStrCat(
    "CMAKE_", linkLanguage, "_LINK_GROUP_USING_", feature, "_SUPPORTED");
  if (makefile->GetDefinition(featureSupported).IsOn()) {
    return true;
  }

  featureSupported =
    cmStrCat("CMAKE_LINK_GROUP_USING_", feature, "_SUPPORTED");
  return makefile->GetDefinition(featureSupported).IsOn();
}